

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate.c
# Opt level: O1

void * mapObject(dsCrate *crate,uint64_t offset,uint64_t length)

{
  ulong uVar1;
  void *pvVar2;
  
  if (crate == (dsCrate *)0x0) {
    pvVar2 = (void *)0x0;
    dsRunLogCallback("%s(): Bad argument %p\n","mapObject",0);
  }
  else {
    uVar1 = (crate->map).offset;
    if ((offset < uVar1) || (uVar1 + (crate->map).length < length + offset)) {
      pvVar2 = (void *)0x0;
      dsRunLogCallback("%s(): Can\'t map region outside of crate.\n","mapObject");
    }
    else {
      pvVar2 = (void *)(offset + (long)(crate->map).ptr);
    }
  }
  return pvVar2;
}

Assistant:

static void *
mapObject(dsCrate *crate, uint64_t offset, uint64_t length)
{
	if (crate == NULL) {
		dsLog("Bad argument %p\n", crate);
		return NULL;
	}

	if ((offset < crate->map.offset) ||
		(offset + length > crate->map.offset + crate->map.length)) {
		dsLog("Can't map region outside of crate.\n");
		return NULL;
	}

	return crate->map.ptr + offset;
}